

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O0

bool __thiscall QPDF::ObjUser::operator<(ObjUser *this,ObjUser *rhs)

{
  bool bVar1;
  ObjUser *rhs_local;
  ObjUser *this_local;
  
  if ((int)this->ou_type < (int)rhs->ou_type) {
    return true;
  }
  if (this->ou_type == rhs->ou_type) {
    if (this->pageno < rhs->pageno) {
      return true;
    }
    if (this->pageno == rhs->pageno) {
      bVar1 = std::operator<(&this->key,&rhs->key);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool
QPDF::ObjUser::operator<(ObjUser const& rhs) const
{
    if (ou_type < rhs.ou_type) {
        return true;
    }
    if (ou_type == rhs.ou_type) {
        if (pageno < rhs.pageno) {
            return true;
        }
        if (pageno == rhs.pageno) {
            return key < rhs.key;
        }
    }
    return false;
}